

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

int * __thiscall
JsUtil::
BaseDictionary<const_Js::PolymorphicInlineCache_*,_InlineCacheData_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::AllocateBuckets(BaseDictionary<const_Js::PolymorphicInlineCache_*,_InlineCacheData_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *this,uint bucketCount)

{
  Recycler *this_00;
  int *piVar1;
  undefined1 local_38 [8];
  TrackAllocData data;
  
  local_38 = (undefined1  [8])&int::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_133463;
  data.filename._0_4_ = 0x447;
  data.plusSize = (ulong)bucketCount;
  this_00 = Memory::Recycler::TrackAllocInfo(this->alloc,(TrackAllocData *)local_38);
  piVar1 = Memory::AllocateArray<Memory::Recycler,int,false>
                     ((Memory *)this_00,(Recycler *)Memory::Recycler::AllocLeaf,0,(ulong)bucketCount
                     );
  return piVar1;
}

Assistant:

int *AllocateBuckets(DECLSPEC_GUARD_OVERFLOW const uint bucketCount)
        {
            return
                AllocateArray<AllocatorType, int, false>(
                    TRACK_ALLOC_INFO(alloc, int, AllocatorType, 0, bucketCount),
                    TypeAllocatorFunc<AllocatorType, int>::GetAllocFunc(),
                    bucketCount);
        }